

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_dispatcher.cpp
# Opt level: O0

unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> __thiscall
spoa::CreateSimdAlignmentEngine
          (spoa *this,AlignmentType type,AlignmentSubtype subtype,int8_t m,int8_t n,int8_t g,
          int8_t e,int8_t q,int8_t c)

{
  int8_t g_local;
  int8_t n_local;
  int8_t m_local;
  AlignmentSubtype subtype_local;
  AlignmentType type_local;
  
  SimdAlignmentEngine<(spoa::Architecture)3>::Create
            ((SimdAlignmentEngine<(spoa::Architecture)3> *)this,type,subtype,m,n,g,e,q,c);
  return (__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
          )(__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<AlignmentEngine> CreateSimdAlignmentEngine(
    AlignmentType type,
    AlignmentSubtype subtype,
    std::int8_t m,
    std::int8_t n,
    std::int8_t g,
    std::int8_t e,
    std::int8_t q,
    std::int8_t c) {
#if defined(SPOA_GENERATE_DISPATCH)
  if (features.avx2) {
    return SimdAlignmentEngine<Architecture::kAVX2>::Create(
        type, subtype, m, n, g, e, q, c);
  } else if (features.sse4_1) {
    return SimdAlignmentEngine<Architecture::kSSE4_1>::Create(
        type, subtype, m, n, g, e, q, c);
  } else {
    return SimdAlignmentEngine<Architecture::kSSE2>::Create(
        type, subtype, m, n, g, e, q, c);
  }
#elif defined(SPOA_GENERATE_DISPATCH_CPUIDEX)
  if (features & SPOA_AVX2) {
    return SimdAlignmentEngine<Architecture::kAVX2>::Create(
        type, subtype, m, n, g, e, q, c);
  } else if (features & SPOA_SSE4_1) {
    return SimdAlignmentEngine<Architecture::kSSE4_1>::Create(
        type, subtype, m, n, g, e, q, c);
  } else {
    return SimdAlignmentEngine<Architecture::kSSE2>::Create(
        type, subtype, m, n, g, e, q, c);
  }
#else
  return SimdAlignmentEngine<Architecture::kAutomatic>::Create(
      type, subtype, m, n, g, e, q, c);
#endif
}